

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  BBox1f BVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  BBox3fa *pBVar9;
  uint uVar10;
  size_t *psVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined4 uVar15;
  long lVar16;
  size_t sVar17;
  uint uVar18;
  unsigned_long uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar41 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar42;
  float fVar47;
  float fVar48;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar49 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar50;
  float fVar56;
  size_t local_168;
  size_t local_160;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_f0;
  anon_class_16_2_07cfa4d6 local_e8;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  BufferView<embree::Vec3fx> *pBVar19;
  
  auVar34 = _DAT_01f45a30;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = _DAT_01f45a30;
  auVar37 = _DAT_01f45a40;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = _DAT_01f45a40;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = auVar34;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = auVar37;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  fVar38 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           super_Geometry.time_range.lower;
  fVar2 = time_range->lower;
  if (time_range->lower <= fVar38) {
    fVar2 = fVar38;
  }
  fVar38 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           super_Geometry.time_range.upper;
  if (time_range->upper <= fVar38) {
    fVar38 = time_range->upper;
  }
  if (fVar2 <= fVar38) {
    uVar20 = r->_begin;
    local_160 = 0;
    local_138 = auVar37;
    local_148 = auVar34;
    local_168 = k;
    for (; uVar20 < r->_end; uVar20 = uVar20 + 1) {
      BVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      fVar24 = BVar3.lower;
      fVar40 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.fnumTimeSegments;
      fVar36 = BVar3.upper - fVar24;
      fVar21 = ceilf(((fVar38 - fVar24) / fVar36) * 0.99999976 * fVar40);
      uVar10 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar20);
      pBVar19 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                vertices.items;
      if ((ulong)(uVar10 + 3) < (pBVar19->super_RawBufferView).num) {
        if (fVar40 <= fVar21) {
          fVar21 = fVar40;
        }
        fVar22 = (fVar2 - fVar24) / fVar36;
        fVar23 = floorf(fVar22 * 1.0000002 * fVar40);
        fVar39 = 0.0;
        if (0.0 <= fVar23) {
          fVar39 = fVar23;
        }
        psVar11 = &pBVar19[(int)fVar39].super_RawBufferView.stride;
        uVar8 = (long)(int)fVar39 - 1;
        fVar39 = (float)DAT_01f4a970;
        fVar23 = DAT_01f4a970._4_4_;
        fVar44 = DAT_01f4a970._8_4_;
        fVar46 = DAT_01f4a970._12_4_;
        fVar48 = (float)DAT_01f4a960;
        fVar51 = DAT_01f4a960._4_4_;
        fVar53 = DAT_01f4a960._8_4_;
        fVar55 = DAT_01f4a960._12_4_;
LAB_0023e8bf:
        uVar8 = uVar8 + 1;
        if ((ulong)(long)(int)fVar21 < uVar8) {
          local_e8.primID = &local_f0;
          fVar36 = (fVar38 - fVar24) / fVar36;
          fVar39 = fVar40 * fVar36;
          local_f0 = uVar20;
          local_e8.this = this;
          fVar21 = floorf(fVar40 * fVar22);
          fVar24 = ceilf(fVar39);
          uVar10 = (uint)fVar21;
          if (fVar21 <= 0.0) {
            fVar21 = 0.0;
          }
          fVar23 = fVar24;
          if (fVar40 <= fVar24) {
            fVar23 = fVar40;
          }
          uVar18 = 0xffffffff;
          if (-1 < (int)uVar10) {
            uVar18 = uVar10;
          }
          iVar7 = (int)fVar40 + 1;
          if ((int)fVar24 < (int)fVar40 + 1) {
            iVar7 = (int)fVar24;
          }
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_e8,(long)(int)fVar21);
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_e8,(long)(int)fVar23);
          fVar24 = fVar40 * fVar22 - fVar21;
          if (iVar7 - uVar18 == 1) {
            if (fVar24 <= 0.0) {
              fVar24 = 0.0;
            }
            fVar40 = 1.0 - fVar24;
            auVar49._0_4_ =
                 fVar40 * blower0.lower.field_0.m128[0] + fVar24 * bupper1.lower.field_0.m128[0];
            auVar49._4_4_ =
                 fVar40 * blower0.lower.field_0.m128[1] + fVar24 * bupper1.lower.field_0.m128[1];
            auVar49._8_4_ =
                 fVar40 * blower0.lower.field_0.m128[2] + fVar24 * bupper1.lower.field_0.m128[2];
            auVar49._12_4_ =
                 fVar40 * blower0.lower.field_0.m128[3] + fVar24 * bupper1.lower.field_0.m128[3];
            auVar41._0_4_ =
                 fVar40 * blower0.upper.field_0.m128[0] + fVar24 * bupper1.upper.field_0.m128[0];
            auVar41._4_4_ =
                 fVar40 * blower0.upper.field_0.m128[1] + fVar24 * bupper1.upper.field_0.m128[1];
            auVar41._8_4_ =
                 fVar40 * blower0.upper.field_0.m128[2] + fVar24 * bupper1.upper.field_0.m128[2];
            auVar41._12_4_ =
                 fVar40 * blower0.upper.field_0.m128[3] + fVar24 * bupper1.upper.field_0.m128[3];
            fVar23 = fVar23 - fVar39;
            if (fVar23 <= 0.0) {
              fVar23 = 0.0;
            }
            fVar40 = 1.0 - fVar23;
            fVar46 = bupper1.lower.field_0.m128[0] * fVar40 + blower0.lower.field_0.m128[0] * fVar23
            ;
            fVar48 = bupper1.lower.field_0.m128[1] * fVar40 + blower0.lower.field_0.m128[1] * fVar23
            ;
            fVar51 = bupper1.lower.field_0.m128[2] * fVar40 + blower0.lower.field_0.m128[2] * fVar23
            ;
            fVar53 = bupper1.lower.field_0.m128[3] * fVar40 + blower0.lower.field_0.m128[3] * fVar23
            ;
            fVar21 = fVar40 * bupper1.upper.field_0.m128[0] + fVar23 * blower0.upper.field_0.m128[0]
            ;
            fVar39 = fVar40 * bupper1.upper.field_0.m128[1] + fVar23 * blower0.upper.field_0.m128[1]
            ;
            fVar44 = fVar40 * bupper1.upper.field_0.m128[2] + fVar23 * blower0.upper.field_0.m128[2]
            ;
            fVar24 = fVar40 * bupper1.upper.field_0.m128[3] + fVar23 * blower0.upper.field_0.m128[3]
            ;
            uVar15 = 1;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&blower1,&local_e8,(long)((int)fVar21 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&bupper0,&local_e8,(long)((int)fVar23 + -1));
            if (fVar24 <= 0.0) {
              fVar24 = 0.0;
            }
            fVar21 = 1.0 - fVar24;
            auVar49._0_4_ =
                 blower0.lower.field_0.m128[0] * fVar21 + blower1.lower.field_0.m128[0] * fVar24;
            auVar49._4_4_ =
                 blower0.lower.field_0.m128[1] * fVar21 + blower1.lower.field_0.m128[1] * fVar24;
            auVar49._8_4_ =
                 blower0.lower.field_0.m128[2] * fVar21 + blower1.lower.field_0.m128[2] * fVar24;
            auVar49._12_4_ =
                 blower0.lower.field_0.m128[3] * fVar21 + blower1.lower.field_0.m128[3] * fVar24;
            auVar41._0_4_ =
                 fVar21 * blower0.upper.field_0.m128[0] + fVar24 * blower1.upper.field_0.m128[0];
            auVar41._4_4_ =
                 fVar21 * blower0.upper.field_0.m128[1] + fVar24 * blower1.upper.field_0.m128[1];
            auVar41._8_4_ =
                 fVar21 * blower0.upper.field_0.m128[2] + fVar24 * blower1.upper.field_0.m128[2];
            auVar41._12_4_ =
                 fVar21 * blower0.upper.field_0.m128[3] + fVar24 * blower1.upper.field_0.m128[3];
            fVar23 = fVar23 - fVar39;
            if (fVar23 <= 0.0) {
              fVar23 = 0.0;
            }
            fVar24 = 1.0 - fVar23;
            fVar46 = bupper1.lower.field_0.m128[0] * fVar24 + bupper0.lower.field_0.m128[0] * fVar23
            ;
            fVar48 = bupper1.lower.field_0.m128[1] * fVar24 + bupper0.lower.field_0.m128[1] * fVar23
            ;
            fVar51 = bupper1.lower.field_0.m128[2] * fVar24 + bupper0.lower.field_0.m128[2] * fVar23
            ;
            fVar53 = bupper1.lower.field_0.m128[3] * fVar24 + bupper0.lower.field_0.m128[3] * fVar23
            ;
            fVar21 = fVar24 * bupper1.upper.field_0.m128[0] + fVar23 * bupper0.upper.field_0.m128[0]
            ;
            fVar39 = fVar24 * bupper1.upper.field_0.m128[1] + fVar23 * bupper0.upper.field_0.m128[1]
            ;
            fVar44 = fVar24 * bupper1.upper.field_0.m128[2] + fVar23 * bupper0.upper.field_0.m128[2]
            ;
            fVar24 = fVar24 * bupper1.upper.field_0.m128[3] + fVar23 * bupper0.upper.field_0.m128[3]
            ;
            pBVar9 = (BBox3fa *)(ulong)uVar10;
            if ((int)uVar10 < 0) {
              pBVar9 = (BBox3fa *)0xffffffff;
            }
            sVar17 = (size_t)(int)pBVar9;
            while( true ) {
              sVar17 = sVar17 + 1;
              uVar15 = SUB84(pBVar9,0);
              if ((long)iVar7 <= (long)sVar17) break;
              fVar23 = ((float)(int)sVar17 / fVar40 - fVar22) / (fVar36 - fVar22);
              fVar55 = 1.0 - fVar23;
              fVar52 = auVar49._4_4_;
              fVar54 = auVar49._8_4_;
              fVar56 = auVar49._12_4_;
              fVar43 = auVar41._4_4_;
              fVar45 = auVar41._8_4_;
              fVar47 = auVar41._12_4_;
              pBVar9 = linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_e8,sVar17);
              auVar33._0_4_ = bi.lower.field_0.m128[0] - (auVar49._0_4_ * fVar55 + fVar46 * fVar23);
              auVar33._4_4_ = bi.lower.field_0.m128[1] - (fVar52 * fVar55 + fVar48 * fVar23);
              auVar33._8_4_ = bi.lower.field_0.m128[2] - (fVar54 * fVar55 + fVar51 * fVar23);
              auVar33._12_4_ = bi.lower.field_0.m128[3] - (fVar56 * fVar55 + fVar53 * fVar23);
              auVar35._0_4_ = bi.upper.field_0.m128[0] - (fVar55 * auVar41._0_4_ + fVar23 * fVar21);
              auVar35._4_4_ = bi.upper.field_0.m128[1] - (fVar55 * fVar43 + fVar23 * fVar39);
              auVar35._8_4_ = bi.upper.field_0.m128[2] - (fVar55 * fVar45 + fVar23 * fVar44);
              auVar35._12_4_ = bi.upper.field_0.m128[3] - (fVar55 * fVar47 + fVar23 * fVar24);
              auVar33 = minps(auVar33,ZEXT816(0));
              auVar35 = maxps(auVar35,ZEXT816(0));
              auVar49._0_4_ = auVar49._0_4_ + auVar33._0_4_;
              auVar49._4_4_ = fVar52 + auVar33._4_4_;
              auVar49._8_4_ = fVar54 + auVar33._8_4_;
              auVar49._12_4_ = fVar56 + auVar33._12_4_;
              fVar46 = fVar46 + auVar33._0_4_;
              fVar48 = fVar48 + auVar33._4_4_;
              fVar51 = fVar51 + auVar33._8_4_;
              fVar53 = fVar53 + auVar33._12_4_;
              auVar41._0_4_ = auVar41._0_4_ + auVar35._0_4_;
              auVar41._4_4_ = fVar43 + auVar35._4_4_;
              auVar41._8_4_ = fVar45 + auVar35._8_4_;
              auVar41._12_4_ = fVar47 + auVar35._12_4_;
              fVar21 = fVar21 + auVar35._0_4_;
              fVar39 = fVar39 + auVar35._4_4_;
              fVar44 = fVar44 + auVar35._8_4_;
              fVar24 = fVar24 + auVar35._12_4_;
            }
          }
          auVar30._4_4_ = -(uint)(auVar49._4_4_ <= auVar41._4_4_);
          auVar30._0_4_ = -(uint)(auVar49._0_4_ <= auVar41._0_4_);
          auVar30._8_4_ = -(uint)(auVar49._8_4_ <= auVar41._8_4_);
          auVar30._12_4_ = -(uint)(auVar49._12_4_ <= auVar41._12_4_);
          uVar15 = movmskps(uVar15,auVar30);
          if (((~(byte)uVar15 & 7) == 0) &&
             (auVar31._4_4_ = -(uint)(fVar48 <= fVar39), auVar31._0_4_ = -(uint)(fVar46 <= fVar21),
             auVar31._8_4_ = -(uint)(fVar51 <= fVar44), auVar31._12_4_ = -(uint)(fVar53 <= fVar24),
             uVar15 = movmskps(CONCAT31((int3)((uint)uVar15 >> 8),~(byte)uVar15),auVar31),
             (~(byte)uVar15 & 7) == 0)) {
            auVar6._4_4_ = fVar48;
            auVar6._0_4_ = fVar46;
            auVar6._8_4_ = fVar51;
            auVar6._12_4_ = fVar53;
            auVar49 = minps(auVar49,auVar6);
            auVar5._4_4_ = fVar39;
            auVar5._0_4_ = fVar21;
            auVar5._8_4_ = fVar44;
            auVar5._12_4_ = fVar24;
            auVar41 = maxps(auVar41,auVar5);
            aVar50._0_12_ = auVar49._0_12_;
            aVar50.m128[3] = (float)geomID;
            aVar42._0_12_ = auVar41._0_12_;
            aVar42.m128[3] = (float)uVar20;
            auVar32._0_4_ = auVar49._0_4_ + auVar41._0_4_;
            auVar32._4_4_ = auVar49._4_4_ + auVar41._4_4_;
            auVar32._8_4_ = auVar49._8_4_ + auVar41._8_4_;
            auVar32._12_4_ = (float)geomID + (float)uVar20;
            local_148 = minps(local_148,(undefined1  [16])aVar50);
            local_138 = maxps(local_138,(undefined1  [16])aVar42);
            auVar34 = minps(auVar34,auVar32);
            auVar37 = maxps(auVar37,auVar32);
            local_160 = local_160 + 1;
            prims[local_168].lower.field_0 = aVar50;
            prims[local_168].upper.field_0 = aVar42;
            local_168 = local_168 + 1;
          }
        }
        else {
          pcVar4 = ((RawBufferView *)(psVar11 + -2))->ptr_ofs;
          sVar17 = *psVar11;
          lVar16 = sVar17 * uVar10;
          lVar14 = sVar17 * (uVar10 + 1);
          lVar13 = sVar17 * (uVar10 + 2);
          lVar12 = sVar17 * (uVar10 + 3);
          auVar25._4_4_ = -(uint)(fVar23 <= ABS(*(float *)(pcVar4 + lVar14 + 0xc)));
          auVar25._0_4_ = -(uint)(fVar39 <= ABS(*(float *)(pcVar4 + lVar16 + 0xc)));
          auVar25._8_4_ = -(uint)(fVar44 <= ABS(*(float *)(pcVar4 + lVar13 + 0xc)));
          auVar25._12_4_ = -(uint)(fVar46 <= ABS(*(float *)(pcVar4 + lVar12 + 0xc)));
          uVar18 = movmskps((int)pBVar19,auVar25);
          pBVar19 = (BufferView<embree::Vec3fx> *)(ulong)uVar18;
          if (uVar18 == 0) {
            pfVar1 = (float *)(pcVar4 + lVar16);
            auVar26._0_4_ = -(uint)(*pfVar1 < fVar39 && fVar48 < *pfVar1);
            auVar26._4_4_ = -(uint)(pfVar1[1] < fVar23 && fVar51 < pfVar1[1]);
            auVar26._8_4_ = -(uint)(pfVar1[2] < fVar44 && fVar53 < pfVar1[2]);
            auVar26._12_4_ = -(uint)(pfVar1[3] < fVar46 && fVar55 < pfVar1[3]);
            uVar15 = movmskps((int)lVar16,auVar26);
            if ((~(byte)uVar15 & 7) == 0) {
              pfVar1 = (float *)(pcVar4 + lVar14);
              auVar27._0_4_ = -(uint)(*pfVar1 < fVar39 && fVar48 < *pfVar1);
              auVar27._4_4_ = -(uint)(pfVar1[1] < fVar23 && fVar51 < pfVar1[1]);
              auVar27._8_4_ = -(uint)(pfVar1[2] < fVar44 && fVar53 < pfVar1[2]);
              auVar27._12_4_ = -(uint)(pfVar1[3] < fVar46 && fVar55 < pfVar1[3]);
              uVar15 = movmskps((int)lVar14,auVar27);
              if ((~(byte)uVar15 & 7) == 0) {
                pfVar1 = (float *)(pcVar4 + lVar13);
                auVar28._0_4_ = -(uint)(*pfVar1 < fVar39 && fVar48 < *pfVar1);
                auVar28._4_4_ = -(uint)(pfVar1[1] < fVar23 && fVar51 < pfVar1[1]);
                auVar28._8_4_ = -(uint)(pfVar1[2] < fVar44 && fVar53 < pfVar1[2]);
                auVar28._12_4_ = -(uint)(pfVar1[3] < fVar46 && fVar55 < pfVar1[3]);
                uVar15 = movmskps((int)lVar13,auVar28);
                if ((~(byte)uVar15 & 7) == 0) goto code_r0x0023e984;
              }
            }
          }
        }
      }
LAB_0023e9bf:
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_148._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_148._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_138._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_138._8_8_;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
     field_0.m128 = auVar34;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
     field_0.m128 = auVar37;
    __return_storage_ptr__->end = local_160;
  }
  return __return_storage_ptr__;
code_r0x0023e984:
  psVar11 = psVar11 + 7;
  pfVar1 = (float *)(pcVar4 + lVar12);
  auVar29._0_4_ = -(uint)(*pfVar1 < fVar39 && fVar48 < *pfVar1);
  auVar29._4_4_ = -(uint)(pfVar1[1] < fVar23 && fVar51 < pfVar1[1]);
  auVar29._8_4_ = -(uint)(pfVar1[2] < fVar44 && fVar53 < pfVar1[2]);
  auVar29._12_4_ = -(uint)(pfVar1[3] < fVar46 && fVar55 < pfVar1[3]);
  uVar15 = movmskps((int)pcVar4,auVar29);
  if ((~(byte)uVar15 & 7) != 0) goto LAB_0023e9bf;
  goto LAB_0023e8bf;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }